

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall BMP::writeFrequencyProbability(BMP *this,ofstream *out)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  GreyCount *pGVar4;
  GreyCount local_b8;
  
  if (out == (ofstream *)0x0) {
    out = (ofstream *)&std::cout;
  }
  pGVar4 = this->alphabet->symbol;
  for (lVar3 = (long)this->alphabet->num << 7; lVar3 != 0; lVar3 = lVar3 + -0x80) {
    bitMap::GreyCount::GreyCount(&local_b8,pGVar4);
    lVar1 = *(long *)out;
    *(undefined8 *)((ostream *)out + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    *(uint *)((ostream *)out + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)((ostream *)out + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
    *(undefined8 *)((ostream *)out + *(long *)(lVar1 + -0x18) + 8) = 5;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,(uint)local_b8.tone);
    std::operator<<(poVar2,": ");
    poVar2 = std::ostream::_M_insert<long_double>(local_b8.frq);
    std::endl<char,std::char_traits<char>>(poVar2);
    bitMap::GreyCount::~GreyCount(&local_b8);
    pGVar4 = pGVar4 + 1;
  }
  return;
}

Assistant:

void BMP::writeFrequencyProbability( std::ofstream *out )
{
    using namespace std;
    bool flag;
    if ( out != nullptr )
        flag = true;
    else
        flag = false;

    for_each( alphabet->symbol, alphabet->symbol+alphabet->num, [ & ]( bitMap::GreyCount a ){
        if ( flag ) {
            ( *out ) << setw( 8 ) << fixed << setprecision( 5 ) << ( int ) a.tone << ": " << a.frq << endl;
        } else {
            cout << setw( 8 ) << fixed << setprecision( 5 ) << ( int ) a.tone << ": " << a.frq << endl;
        }
    });
}